

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O2

ngx_slab_page_t * ngx_slab_alloc_pages(ngx_slab_pool_t *pool,ngx_uint_t pages)

{
  ngx_slab_page_t *pnVar1;
  ulong uVar2;
  uintptr_t uVar3;
  ngx_slab_page_t *pnVar4;
  ngx_slab_page_t **ppnVar5;
  ngx_slab_page_t *pnVar6;
  long lVar7;
  bool bVar8;
  
  pnVar1 = &pool->free;
  do {
    pnVar1 = pnVar1->next;
    if (pnVar1 == &pool->free) {
      if ((pool->field_0x79 & 1) != 0) {
        ngx_slab_error(pool,3,"ngx_slab_alloc() failed: no memory");
      }
      return (ngx_slab_page_t *)0x0;
    }
    uVar2 = pnVar1->slab;
  } while (uVar2 < pages);
  if (uVar2 < pages || uVar2 - pages == 0) {
    pnVar6 = pnVar1->next;
    pnVar4 = (ngx_slab_page_t *)pnVar1->prev;
    pnVar4->next = pnVar6;
  }
  else {
    pnVar4 = pnVar1 + pages;
    pnVar1[uVar2 - 1].prev = (uintptr_t)pnVar4;
    pnVar1[pages].slab = uVar2 - pages;
    pnVar1[pages].next = pnVar1->next;
    uVar3 = pnVar1->prev;
    pnVar1[pages].prev = uVar3;
    *(ngx_slab_page_t **)(uVar3 + 8) = pnVar4;
    pnVar6 = pnVar1->next;
  }
  pnVar6->prev = (uintptr_t)pnVar4;
  pnVar1->slab = pages | 0x8000000000000000;
  pnVar1->next = (ngx_slab_page_t *)0x0;
  pnVar1->prev = 0;
  pool->pfree = pool->pfree - pages;
  lVar7 = pages - 1;
  if (lVar7 != 0) {
    ppnVar5 = &pnVar1[1].next;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      ((ngx_slab_page_t *)(ppnVar5 + -1))->slab = 0xffffffffffffffff;
      *ppnVar5 = (ngx_slab_page_t *)0x0;
      ppnVar5[1] = (ngx_slab_page_t *)0x0;
      ppnVar5 = ppnVar5 + 3;
    }
    return pnVar1;
  }
  return pnVar1;
}

Assistant:

static ngx_slab_page_t *
ngx_slab_alloc_pages(ngx_slab_pool_t *pool, ngx_uint_t pages)
{
    ngx_slab_page_t  *page, *p;

    for (page = pool->free.next; page != &pool->free; page = page->next) {

        if (page->slab >= pages) {

            if (page->slab > pages) {
                page[page->slab - 1].prev = (uintptr_t) &page[pages];

                page[pages].slab = page->slab - pages;
                page[pages].next = page->next;
                page[pages].prev = page->prev;

                p = (ngx_slab_page_t *) page->prev;
                p->next = &page[pages];
                page->next->prev = (uintptr_t) &page[pages];

            } else {
                p = (ngx_slab_page_t *) page->prev;
                p->next = page->next;
                page->next->prev = page->prev;
            }

            page->slab = pages | NGX_SLAB_PAGE_START;
            page->next = NULL;
            page->prev = NGX_SLAB_PAGE;

            pool->pfree -= pages;

            if (--pages == 0) {
                return page;
            }

            for (p = page + 1; pages; pages--) {
                p->slab = NGX_SLAB_PAGE_BUSY;
                p->next = NULL;
                p->prev = NGX_SLAB_PAGE;
                p++;
            }

            return page;
        }
    }

    if (pool->log_nomem) {
        ngx_slab_error(pool, NGX_LOG_CRIT,
                       "ngx_slab_alloc() failed: no memory");
    }

    return NULL;
}